

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

array * cs_impl::path_cs_ext::scan(string *path)

{
  char *__name;
  undefined8 uVar1;
  array *in_RDI;
  dirent *dp;
  array entries;
  DIR *dir;
  string *in_stack_ffffffffffffff18;
  dirent *in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff30;
  char (*in_stack_ffffffffffffff38) [256];
  allocator *paVar2;
  dirent *local_a8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffff70;
  allocator local_39;
  string local_38 [32];
  DIR *local_18;
  
  __name = (char *)std::__cxx11::string::c_str();
  local_18 = opendir(__name);
  if (local_18 == (DIR *)0x0) {
    uVar1 = __cxa_allocate_exception(0x20);
    paVar2 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Path does not exist.",paVar2);
    cs::lang_error::lang_error((lang_error *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar1,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x2609a4);
  local_a8 = readdir(local_18);
  while (local_a8 != (dirent *)0x0) {
    any::make<cs_impl::path_cs_ext::path_info,char(&)[256],unsigned_char&>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffff20,
               (value_type *)in_stack_ffffffffffffff18);
    any::~any((any *)0x260a05);
    in_stack_ffffffffffffff20 = readdir(local_18);
    local_a8 = in_stack_ffffffffffffff20;
  }
  closedir(local_18);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffff20,
             (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffff18);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

array scan(const string &path)
		{
			DIR *dir = ::opendir(path.c_str());
			if (dir == nullptr)
				throw cs::lang_error("Path does not exist.");
			array
			entries;
			for (dirent *dp = ::readdir(dir); dp != nullptr; dp = ::readdir(dir))
				entries.push_back(var::make<path_info>(dp->d_name, dp->d_type));
			::closedir(dir);
			return std::move(entries);
		}